

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int nni_url_parse_inline(nng_url *url,char *raw)

{
  int iVar1;
  int rv;
  char *raw_local;
  nng_url *url_local;
  
  iVar1 = nni_url_parse_inline_inner(url,raw);
  if (iVar1 != 0) {
    nni_url_fini(url);
  }
  return iVar1;
}

Assistant:

int
nni_url_parse_inline(nng_url *url, const char *raw)
{
	int rv = nni_url_parse_inline_inner(url, raw);
	if (rv != 0) {
		nni_url_fini(url);
	}
	return (rv);
}